

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

char * oonf_layer2_data_to_string
                 (char *buffer,size_t length,oonf_layer2_data *data,oonf_layer2_metadata *meta,
                 _Bool raw)

{
  long lVar1;
  char *pcVar2;
  undefined1 local_69 [8];
  isonumber_str iso_str;
  _Bool raw_local;
  oonf_layer2_metadata *meta_local;
  oonf_layer2_data *data_local;
  size_t length_local;
  char *buffer_local;
  
  iso_str.buf[0x28] = raw;
  unique0x100000be = meta;
  if (meta->type == OONF_LAYER2_INTEGER_DATA) {
    lVar1 = isonumber_from_s64(local_69,(data->_value).integer,meta->unit,meta->scaling,raw);
    if (lVar1 == 0) {
      buffer_local = (char *)0x0;
    }
    else {
      buffer_local = (char *)strscpy(buffer,local_69,length);
    }
  }
  else if (meta->type == OONF_LAYER2_BOOLEAN_DATA) {
    pcVar2 = "false";
    if (((data->_value).addr._addr[0] & 1) != 0) {
      pcVar2 = "true";
    }
    buffer_local = (char *)strscpy(buffer,pcVar2,length);
  }
  else {
    buffer_local = (char *)0x0;
  }
  return buffer_local;
}

Assistant:

const char *
oonf_layer2_data_to_string(
  char *buffer, size_t length, const struct oonf_layer2_data *data, const struct oonf_layer2_metadata *meta, bool raw) {
  struct isonumber_str iso_str;

  switch (meta->type) {
    case OONF_LAYER2_INTEGER_DATA:
      if (!isonumber_from_s64(&iso_str, data->_value.integer, meta->unit, meta->scaling, raw)) {
        return NULL;
      }
      return strscpy(buffer, iso_str.buf, length);

    case OONF_LAYER2_BOOLEAN_DATA:
      return strscpy(buffer, json_getbool(data->_value.boolean), length);

    default:
      return NULL;
  }
}